

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_harmless.c
# Opt level: O3

void dwarf_insert_harmless_error(Dwarf_Debug dbg,char *newerror)

{
  uint *puVar1;
  uint uVar2;
  char **ppcVar3;
  char *out;
  size_t inlen;
  uint uVar4;
  
  if ((dbg != (Dwarf_Debug)0x0) && (dbg->de_magic == 0xebfdebfd)) {
    ppcVar3 = (dbg->de_harmless_errors).dh_errors;
    if (ppcVar3 == (char **)0x0) {
      puVar1 = &(dbg->de_harmless_errors).dh_errs_count;
      *puVar1 = *puVar1 + 1;
    }
    else {
      uVar4 = (dbg->de_harmless_errors).dh_next_to_use;
      out = ppcVar3[uVar4];
      inlen = strlen(newerror);
      _dwarf_safe_strcpy(out,300,newerror,inlen);
      uVar2 = (dbg->de_harmless_errors).dh_maxcount;
      uVar4 = (uVar4 + 1) % uVar2;
      puVar1 = &(dbg->de_harmless_errors).dh_errs_count;
      *puVar1 = *puVar1 + 1;
      (dbg->de_harmless_errors).dh_next_to_use = uVar4;
      if (uVar4 == (dbg->de_harmless_errors).dh_first) {
        uVar4 = uVar4 + 1;
        if (uVar4 == uVar2) {
          uVar4 = 0;
        }
        (dbg->de_harmless_errors).dh_first = uVar4;
      }
    }
  }
  return;
}

Assistant:

void
dwarf_insert_harmless_error(Dwarf_Debug dbg,
    char *newerror)
{
    struct Dwarf_Harmless_s *dhp = 0;
    unsigned next = 0;
    unsigned cur = 0;
    char *msgspace = 0;

    if (IS_INVALID_DBG(dbg)) {
        return;
    }
    dhp = &dbg->de_harmless_errors;
    cur = dhp->dh_next_to_use;
    if (!dhp->dh_errors) {
        dhp->dh_errs_count++;
        return;
    }
    msgspace = dhp->dh_errors[cur];
    _dwarf_safe_strcpy(msgspace,
        DW_HARMLESS_ERROR_MSG_STRING_SIZE,
        newerror,
        strlen(newerror));
    next = (cur+1) % dhp->dh_maxcount;
    dhp->dh_errs_count++;
    dhp->dh_next_to_use = next;
    if (dhp->dh_next_to_use ==  dhp->dh_first) {
        /* Array is full set full invariant. */
        dhp->dh_first = (dhp->dh_first+1) % dhp->dh_maxcount;
    }
}